

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

int __thiscall ImFontAtlas::AddCustomRectRegular(ImFontAtlas *this,uint id,int width,int height)

{
  CustomRect *in_RDI;
  CustomRect r;
  CustomRect *in_stack_ffffffffffffffb8;
  
  CustomRect::CustomRect(in_RDI);
  ImVector<ImFontAtlas::CustomRect>::push_back
            ((ImVector<ImFontAtlas::CustomRect> *)in_RDI,in_stack_ffffffffffffffb8);
  return (int)in_RDI[2].GlyphOffset.x + -1;
}

Assistant:

int ImFontAtlas::AddCustomRectRegular(unsigned int id, int width, int height)
{
    IM_ASSERT(id >= 0x10000);
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    CustomRect r;
    r.ID = id;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}